

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_file_reader.hpp
# Opt level: O0

void __thiscall duckdb::BaseUnionData::~BaseUnionData(BaseUnionData *this)

{
  OpenFileInfo *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__BaseUnionData_00bff288;
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x67b81a);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x67b828);
  shared_ptr<duckdb::BaseFileReader,_true>::~shared_ptr
            ((shared_ptr<duckdb::BaseFileReader,_true> *)0x67b836);
  OpenFileInfo::~OpenFileInfo(in_RDI);
  return;
}

Assistant:

DUCKDB_API virtual ~BaseUnionData() = default;